

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O2

void Gia_ManHashAlloc(Gia_Man_t *p)

{
  int nCapMin;
  int iVar1;
  uint p_00;
  int Fill;
  int Fill_00;
  
  if ((p->vHTable).nSize == 0) {
    iVar1 = Gia_ManAndNum(p);
    if (iVar1 == 0) {
      p_00 = p->nObjsAlloc;
    }
    else {
      p_00 = iVar1 + 1000;
    }
    iVar1 = Abc_PrimeCudd(p_00);
    Vec_IntFill(&p->vHTable,iVar1,Fill);
    iVar1 = (p->vHTable).nSize;
    nCapMin = p->nObjs;
    if (p->nObjs < iVar1) {
      nCapMin = iVar1;
    }
    Vec_IntGrow(&p->vHash,nCapMin);
    Vec_IntFill(&p->vHash,p->nObjs,Fill_00);
    return;
  }
  __assert_fail("Vec_IntSize(&p->vHTable) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaHash.c"
                ,0x6b,"void Gia_ManHashAlloc(Gia_Man_t *)");
}

Assistant:

void Gia_ManHashAlloc( Gia_Man_t * p )  
{
    assert( Vec_IntSize(&p->vHTable) == 0 );
    Vec_IntFill( &p->vHTable, Abc_PrimeCudd( Gia_ManAndNum(p) ? Gia_ManAndNum(p) + 1000 : p->nObjsAlloc ), 0 );
    Vec_IntGrow( &p->vHash, Abc_MaxInt(Vec_IntSize(&p->vHTable), Gia_ManObjNum(p)) );
    Vec_IntFill( &p->vHash, Gia_ManObjNum(p), 0 );
//printf( "Alloced table with %d entries.\n", Vec_IntSize(&p->vHTable) );
}